

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O3

pqpair stat2pq(double val,int code,double p1,double p2,double p3)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  double dVar6;
  double dVar7;
  double dVar8;
  pqpair pVar9;
  double x;
  double q;
  double p;
  int status;
  double df;
  int which;
  undefined4 uStack_44;
  double bound;
  double ompr;
  int status_3;
  undefined1 local_28 [16];
  
  dVar8 = 1.0;
  dVar6 = 0.0;
  dVar7 = 0.0;
  x = val;
  df = p1;
  bound = p2;
  switch(code) {
  case 2:
    val = (val + 1.0) * 0.5;
    p2 = p1 * 0.5;
    p1 = p2;
    goto LAB_0010fcd2;
  case 3:
    pVar9 = student_s2pq(val,p1);
    dVar8 = pVar9.q;
    dVar7 = pVar9.p;
    break;
  case 4:
    _which = (double)CONCAT44(uStack_44,1);
    p = 0.0;
    q = 1.0;
    dVar8 = 1.0;
    dVar7 = 0.0;
    if (((0.0 < val) && (dVar7 = 0.0, 0.0 < p1)) && (dVar7 = dVar6, 0.0 < p2)) {
      cdff(&which,&p,&q,&x,&df,&bound,&status,&ompr);
      dVar8 = q;
      dVar7 = p;
    }
    break;
  case 5:
    goto switchD_0010f906_caseD_5;
  case 6:
    goto switchD_0010f906_caseD_6;
  case 7:
LAB_0010fcd2:
    pVar9 = beta_s2pq(val,p1,p2);
    dVar8 = pVar9.q;
    dVar7 = pVar9.p;
    break;
  case 8:
    status = 1;
    p = 0.0;
    q = 1.0;
    dVar8 = 1.0;
    dVar7 = 0.0;
    if (((0.0 <= val) && (dVar7 = 0.0, 0.0 < p1)) && (dVar7 = 0.0, 0.0 <= p2)) {
      ompr = 1.0 - p2;
      cdfbin(&status,&p,&q,&x,&df,&bound,&ompr,&status_3,(double *)&which);
      dVar8 = q;
      dVar7 = p;
    }
    break;
  case 9:
    _which = (double)CONCAT44(uStack_44,1);
    p = 0.0;
    q = 1.0;
    dVar8 = 1.0;
    dVar7 = 0.0;
    if (((0.0 < val) && (dVar7 = 0.0, 0.0 < p1)) && (dVar7 = 0.0, 0.0 < p2)) {
      cdfgam(&which,&p,&q,&x,&df,&bound,&status,&ompr);
      dVar8 = q;
      dVar7 = p;
    }
    break;
  case 10:
    ompr = (double)CONCAT44(ompr._4_4_,1);
    p = 0.0;
    q = 1.0;
    dVar8 = 1.0;
    dVar7 = 0.0;
    if ((0.0 <= val) && (dVar7 = 0.0, 0.0 <= p1)) {
      cdfpoi((int *)&ompr,&p,&q,&x,&df,&which,&bound);
      dVar8 = q;
      dVar7 = p;
    }
    break;
  case 0xb:
    dVar7 = 0.0;
    if (p2 <= 0.0) break;
    val = (val - p1) / p2;
    goto switchD_0010f906_caseD_5;
  case 0xc:
    status = 1;
    p = 0.0;
    q = 1.0;
    dVar8 = 1.0;
    dVar7 = 0.0;
    if (((0.0 < val) && (dVar7 = 0.0, 0.0 < p1)) &&
       ((dVar7 = 0.0, 0.0 < p2 && (dVar7 = 0.0, 0.0 <= p3)))) {
      _which = p3;
      cdffnc(&status,&p,&q,&x,&df,&bound,(double *)&which,&status_3,&ompr);
      dVar8 = q;
      dVar7 = p;
    }
    break;
  case 0xd:
    _which = (double)CONCAT44(uStack_44,1);
    p = 0.0;
    q = 1.0;
    dVar8 = 1.0;
    dVar7 = 0.0;
    if (((0.0 < val) && (dVar7 = 0.0, 0.0 < p1)) && (dVar7 = 0.0, 0.0 <= p2)) {
      ompr = p2;
      cdfchn(&which,&p,&q,&x,&df,&ompr,&status,&bound);
      dVar8 = q;
      dVar7 = p;
    }
    break;
  case 0xe:
    dVar7 = 0.0;
    if (p2 <= 0.0) break;
    dVar8 = (val - p1) / p2;
    if (0.0 <= dVar8) {
      dVar8 = exp(dVar8);
      dVar8 = 1.0 / (dVar8 + 1.0);
      goto LAB_0010ff66;
    }
    dVar8 = exp(-dVar8);
    dVar6 = 1.0 / (dVar8 + 1.0);
    goto LAB_00110003;
  case 0xf:
    dVar7 = 0.0;
    if (p2 <= 0.0) break;
    dVar8 = (val - p1) / p2;
    if (0.0 <= dVar8) {
      dVar8 = exp(-dVar8);
      dVar8 = dVar8 * 0.5;
      goto LAB_0010ff66;
    }
    dVar6 = exp(dVar8);
    dVar6 = dVar6 * 0.5;
    goto LAB_00110003;
  case 0x10:
    dVar7 = 0.0;
    if (p1 < p2) {
      dVar7 = (val - p1) / (p2 - p1);
      dVar6 = 1.0;
      if (dVar7 <= 1.0) {
        dVar6 = dVar7;
      }
      dVar8 = 1.0 - dVar7;
      dVar7 = (double)(-(ulong)(0.0 < dVar7) & (ulong)dVar6);
    }
    break;
  case 0x11:
    pVar9 = tnonc_s2pq(val,p1,p2);
    dVar8 = pVar9.q;
    dVar7 = pVar9.p;
    break;
  case 0x12:
    dVar7 = 0.0;
    if ((((p2 <= 0.0) || (dVar7 = 0.0, p3 <= 0.0)) ||
        (dVar6 = (val - p1) / p2, dVar7 = 0.0, dVar6 <= 0.0)) || (dVar7 = 0.0, p3 <= 0.0)) break;
    dVar8 = pow(dVar6,p3);
    local_28._8_4_ = extraout_XMM0_Dc;
    local_28._0_8_ = dVar8;
    local_28._12_4_ = extraout_XMM0_Dd;
    dVar8 = exp(-dVar8);
    if ((double)local_28._0_8_ < 0.0001) {
      dVar7 = ((((double)local_28._0_8_ / -24.0 + 0.16666666666666666) * (double)local_28._0_8_ +
               -0.5) * (double)local_28._0_8_ + 1.0) * (double)local_28._0_8_;
      break;
    }
    goto LAB_0010ff66;
  case 0x13:
    dVar7 = 0.0;
    if ((val <= 0.0) || (dVar7 = 0.0, p1 <= 0.0)) break;
    val = val * val;
    goto switchD_0010f906_caseD_6;
  case 0x14:
    dVar7 = 0.0;
    if ((0.0 < p1) && (dVar7 = 0.0, 0.0 < p2)) {
      pVar9 = invgauss_s2pq(val / p1,p2 / p1);
      dVar8 = pVar9.q;
      dVar7 = pVar9.p;
    }
    break;
  case 0x15:
    dVar7 = 0.0;
    if (p2 <= 0.0) break;
    dVar8 = (val - p1) / p2;
    if (-5.0 < dVar8) {
      dVar8 = exp(-dVar8);
      local_28._8_4_ = extraout_XMM0_Dc_00;
      local_28._0_8_ = dVar8;
      local_28._12_4_ = extraout_XMM0_Dd_00;
      dVar6 = exp(-dVar8);
      if ((double)local_28._0_8_ < 0.0001) {
        dVar8 = ((((double)local_28._0_8_ / -24.0 + 0.16666666666666666) * (double)local_28._0_8_ +
                 -0.5) * (double)local_28._0_8_ + 1.0) * (double)local_28._0_8_;
        dVar7 = dVar6;
        break;
      }
    }
LAB_00110003:
    dVar8 = 1.0 - dVar6;
    dVar7 = dVar6;
    break;
  case 0x16:
    bVar1 = 0.0 <= val;
    if (1.0 <= val) {
      val = 1.0;
    }
    dVar8 = (double)(~-(ulong)bVar1 & 0x3ff0000000000000 | (ulong)val & -(ulong)bVar1);
    goto LAB_0010ff66;
  case 0x17:
    iVar3 = (int)val;
    iVar2 = -iVar3;
    if (iVar3 < 1) {
      iVar2 = iVar3;
    }
    dVar8 = exp((double)iVar2);
    uVar4 = SUB84(dVar8,0);
    uVar5 = (undefined4)((ulong)dVar8 >> 0x20);
    goto LAB_0010ff5a;
  case 0x18:
    iVar3 = (int)val;
    iVar2 = -iVar3;
    if (iVar3 < 1) {
      iVar2 = iVar3;
    }
    dVar8 = pow(10.0,(double)iVar2);
    uVar4 = SUB84(dVar8,0);
    uVar5 = (undefined4)((ulong)dVar8 >> 0x20);
LAB_0010ff5a:
    dVar8 = (double)CONCAT44(uVar5,uVar4);
LAB_0010ff66:
    dVar7 = 1.0 - dVar8;
  }
switchD_0010f906_default:
  pVar9.q = dVar8;
  pVar9.p = dVar7;
  return pVar9;
switchD_0010f906_caseD_6:
  pVar9 = chisq_s2pq(val,p1);
  dVar8 = pVar9.q;
  dVar7 = pVar9.p;
  goto switchD_0010f906_default;
switchD_0010f906_caseD_5:
  x = val;
  cumnor(&x,&p,&q);
  dVar8 = q;
  dVar7 = p;
  goto switchD_0010f906_default;
}

Assistant:

static pqpair stat2pq( double val, int code, double p1,double p2,double p3 )
{
   pqpair pq={0.0,1.0} ;

   switch( code ){

     case NIFTI_INTENT_CORREL:     pq = correl_s2pq  ( val, p1 )      ; break;
     case NIFTI_INTENT_TTEST:      pq = student_s2pq ( val, p1 )      ; break;
     case NIFTI_INTENT_FTEST:      pq = fstat_s2pq   ( val, p1,p2 )   ; break;
     case NIFTI_INTENT_ZSCORE:     pq = normal_s2pq  ( val )          ; break;
     case NIFTI_INTENT_CHISQ:      pq = chisq_s2pq   ( val, p1 )      ; break;
     case NIFTI_INTENT_BETA:       pq = beta_s2pq    ( val, p1,p2 )   ; break;
     case NIFTI_INTENT_BINOM:      pq = binomial_s2pq( val, p1,p2 )   ; break;
     case NIFTI_INTENT_GAMMA:      pq = gamma_s2pq   ( val, p1,p2 )   ; break;
     case NIFTI_INTENT_POISSON:    pq = poisson_s2pq ( val, p1 )      ; break;
     case NIFTI_INTENT_FTEST_NONC: pq = fnonc_s2pq   ( val, p1,p2,p3 ); break;
     case NIFTI_INTENT_CHISQ_NONC: pq = chsqnonc_s2pq( val, p1,p2    ); break;
     case NIFTI_INTENT_TTEST_NONC: pq = tnonc_s2pq   ( val, p1,p2 )   ; break;
     case NIFTI_INTENT_CHI:        pq = chi_s2pq     ( val, p1 )      ; break;

     /* these distributions are shifted and scaled copies of a standard case */

     case NIFTI_INTENT_INVGAUSS:
        if( p1 > 0.0 && p2 > 0.0 ) pq = invgauss_s2pq( val/p1,p2/p1 ) ; break;

     case NIFTI_INTENT_WEIBULL:
        if( p2 > 0.0 && p3 > 0.0 ) pq = weibull_s2pq ((val-p1)/p2,p3) ; break;

     case NIFTI_INTENT_EXTVAL:
                    if( p2 > 0.0 ) pq = extval1_s2pq ( (val-p1)/p2 )  ; break;

     case NIFTI_INTENT_NORMAL:
                    if( p2 > 0.0 ) pq = normal_s2pq  ( (val-p1)/p2 )  ; break;

     case NIFTI_INTENT_LOGISTIC:
                    if( p2 > 0.0 ) pq = logistic_s2pq( (val-p1)/p2 )  ; break;

     case NIFTI_INTENT_LAPLACE:
                    if( p2 > 0.0 ) pq = laplace_s2pq ( (val-p1)/p2 )  ; break;

     case NIFTI_INTENT_UNIFORM:
                    if( p2 > p1  ) pq = uniform_s2pq((val-p1)/(p2-p1)); break;

     /* these cases are trivial (note what is called 'p' is really 'q') */

     case NIFTI_INTENT_PVAL:
                        if( val >= 0.0 && val <= 1.0 ) pq.q = val ;
                                                       pq.p = 1.0-pq.q; break;
     case NIFTI_INTENT_LOGPVAL:
                            pq.q = exp(-abs(val))    ; pq.p = 1.0-pq.q; break;
     case NIFTI_INTENT_LOG10PVAL:
                            pq.q = pow(10.,-abs(val)); pq.p = 1.0-pq.q; break;
   }

   return pq ;
}